

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreateCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName,int fUseAllCis)

{
  Abc_NtkType_t Type;
  Abc_Aig_t *pMan;
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  int iVar6;
  long lVar7;
  Abc_Obj_t *pNode_local;
  Abc_Obj_t *local_428;
  char *local_420;
  char Buffer [1000];
  
  Type = pNtk->ntkType;
  pNode_local = pNode;
  if ((Type & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x36e,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
  uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar1 != 7) {
    if (Type == ABC_NTK_STRASH) {
      if (**(int **)((ulong)pNode & 0xfffffffffffffffe) != 3) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x18d,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) ||
          (uVar1 == 2)) || (uVar1 == 5)) goto LAB_001d886e;
    }
    __assert_fail("Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x36f,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
LAB_001d886e:
  pNtk_00 = Abc_NtkAlloc(Type,pNtk->ntkFunc,1);
  iVar6 = 0;
  local_420 = pNodeName;
  sprintf(Buffer,"%s_%s",pNtk->pName,pNodeName);
  pcVar3 = Extra_UtilStrsav(Buffer);
  pNtk_00->pName = pcVar3;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar4 = Abc_AigConst1(pNtk_00);
    pAVar5 = Abc_AigConst1(pNtk);
    (pAVar5->field_6).pCopy = pAVar4;
  }
  p = Abc_NtkDfsNodes(pNtk,&pNode_local,1);
  do {
    if (pNtk->vCis->nSize <= iVar6) {
      local_428 = Abc_NtkCreatePo(pNtk_00);
      Abc_ObjAssignName(local_428,local_420,(char *)0x0);
      for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar6);
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
          pAVar5 = Abc_ObjChild0Copy(pAVar4);
          p1 = Abc_ObjChild1Copy(pAVar4);
          pAVar5 = Abc_AigAnd(pMan,pAVar5,p1);
          (pAVar4->field_6).pCopy = pAVar5;
        }
        else {
          Abc_NtkDupObj(pNtk_00,pAVar4,0);
          for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] +
                             0x40));
          }
        }
      }
      Abc_ObjAddFanin(local_428,(pNode_local->field_6).pCopy);
      Vec_PtrFree(p);
      iVar6 = Abc_NtkCheck(pNtk_00);
      if (iVar6 == 0) {
        fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
      }
      return pNtk_00;
    }
    pAVar4 = Abc_NtkCi(pNtk,iVar6);
    if (fUseAllCis == 0) {
      iVar2 = Abc_NodeIsTravIdCurrent(pAVar4);
      if (iVar2 != 0) goto LAB_001d8906;
    }
    else {
LAB_001d8906:
      pAVar5 = Abc_NtkCreatePi(pNtk_00);
      (pAVar4->field_6).pCopy = pAVar5;
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,pcVar3,(char *)0x0);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName, int fUseAllCis )
{
    Abc_Ntk_t * pNtkNew; 
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))  ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, &pNode, 1 );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( fUseAllCis || Abc_NodeIsTravIdCurrent(pObj) ) // TravId is set by DFS
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    // add the PO corresponding to this output
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the internal nodes to the new CO
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vNodes );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    return pNtkNew;
}